

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWITypes.cpp
# Opt level: O0

char * GetFlagName(SWI_Flag flag)

{
  char *pcStack_10;
  SWI_Flag flag_local;
  
  if (flag == SWIF_Command) {
    pcStack_10 = "Command";
  }
  else if (flag == SWIF_Transmit) {
    pcStack_10 = "Transmit";
  }
  else if (flag == SWIF_Idle) {
    pcStack_10 = "Idle";
  }
  else if (flag == SWIF_Sleep) {
    pcStack_10 = "Sleep";
  }
  else {
    pcStack_10 = "<unknown>";
  }
  return pcStack_10;
}

Assistant:

const char* GetFlagName( SWI_Flag flag )
{
    switch( flag )
    {
    case SWIF_Transmit:
        return "Transmit";
    case SWIF_Command:
        return "Command";
    case SWIF_Idle:
        return "Idle";
    case SWIF_Sleep:
        return "Sleep";
    };

    return "<unknown>";
}